

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O3

Gia_Man_t * Bmc_EcoMiter(Gia_Man_t *pGold,Gia_Man_t *pOld,Vec_Int_t *vFans)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *__s;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  Gia_Man_t *p;
  size_t sVar11;
  char *__dest;
  Gia_Obj_t *pGVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  Gia_Man_t *pGVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  uint local_50;
  
  iVar9 = pOld->vCos->nSize;
  uVar16 = ~pOld->nRegs + iVar9;
  if (((int)uVar16 < 0) || (iVar9 <= (int)uVar16)) {
LAB_00535af0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar10 = pOld->vCos->pArray[uVar16];
  if (((long)iVar10 < 0) || (pOld->nObjs <= iVar10)) {
LAB_00535a93:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  if (pGold->vCis->nSize != pOld->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x36,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  if (pGold->vCos->nSize != iVar9 + -1) {
    __assert_fail("Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x37,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  pGVar1 = pOld->pObjs + iVar10 + -(ulong)((uint)*(undefined8 *)(pOld->pObjs + iVar10) & 0x1fffffff)
  ;
  if (((int)(uint)*(ulong *)pGVar1 < 0) || (((uint)*(ulong *)pGVar1 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pRoot)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x38,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  p = Gia_ManStart(pGold->nObjs * 3);
  __s = pGold->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar11 = strlen(__s);
    __dest = (char *)malloc(sVar11 + 1);
    strcpy(__dest,__s);
  }
  p->pName = __dest;
  Gia_ManHashAlloc(p);
  pGold->pObjs->Value = 0;
  pVVar14 = pGold->vCis;
  if (0 < pVVar14->nSize) {
    lVar17 = 0;
    do {
      iVar9 = pVVar14->pArray[lVar17];
      if (((long)iVar9 < 0) || (pGold->nObjs <= iVar9)) goto LAB_00535a93;
      pGVar6 = pGold->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p);
      uVar7 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar7 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar13 = p->pObjs;
      if ((pGVar12 < pGVar13) || (pGVar13 + p->nObjs <= pGVar12)) goto LAB_00535ad1;
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * -0x55555555);
      pGVar13 = p->pObjs;
      if ((pGVar12 < pGVar13) || (pGVar13 + p->nObjs <= pGVar12)) goto LAB_00535ad1;
      pGVar6[iVar9].Value = (int)((ulong)((long)pGVar12 - (long)pGVar13) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar14 = pGold->vCis;
    } while (lVar17 < pVVar14->nSize);
  }
  pGVar13 = Gia_ManAppendObj(p);
  uVar7 = *(ulong *)pGVar13;
  *(ulong *)pGVar13 = uVar7 | 0x9fffffff;
  *(ulong *)pGVar13 =
       uVar7 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
  pGVar6 = p->pObjs;
  if ((pGVar13 < pGVar6) || (pGVar6 + p->nObjs <= pGVar13)) {
LAB_00535ad1:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * -0x55555555);
  pGVar6 = p->pObjs;
  if ((pGVar13 < pGVar6) || (pGVar6 + p->nObjs <= pGVar13)) goto LAB_00535ad1;
  iVar9 = pGold->nObjs;
  if (0 < iVar9) {
    lVar17 = 8;
    lVar18 = 0;
    do {
      pGVar12 = pGold->pObjs;
      if (pGVar12 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)((long)pGVar12 + lVar17 + -8);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        uVar16 = *(uint *)((long)pGVar12 +
                          lVar17 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3);
        if (((int)uVar16 < 0) ||
           (uVar2 = *(uint *)((long)pGVar12 +
                             lVar17 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) goto LAB_00535ab2;
        iVar9 = Gia_ManHashAnd(p,uVar16 ^ (uint)(uVar7 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar7 >> 0x3d) & 1);
        *(int *)(&pGVar12->field_0x0 + lVar17) = iVar9;
        iVar9 = pGold->nObjs;
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar18 < iVar9);
  }
  lVar17 = (long)pGold->vCos->nSize;
  if (0 < lVar17) {
    piVar8 = pGold->vCos->pArray;
    lVar18 = 0;
    do {
      iVar10 = piVar8[lVar18];
      if (((long)iVar10 < 0) || (iVar9 <= iVar10)) goto LAB_00535a93;
      if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = pGold->pObjs + iVar10;
      if ((int)pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value < 0)
      goto LAB_00535ab2;
      pGVar12->Value =
           (uint)*(undefined8 *)pGVar12 >> 0x1d & 1 ^
           pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  uVar16 = (int)((ulong)((long)pGVar13 - (long)pGVar6) >> 2) * 0x55555556;
  pGVar6 = pOld->pObjs;
  pGVar6->Value = 0;
  lVar17 = (long)pOld->vCis->nSize;
  if (lVar17 < 1) {
    iVar10 = pOld->nObjs;
    if (iVar10 < 1) goto LAB_005356c0;
  }
  else {
    piVar8 = pOld->vCis->pArray;
    lVar18 = 0;
    do {
      iVar3 = piVar8[lVar18];
      if (((long)iVar3 < 0) || (iVar10 = pOld->nObjs, iVar10 <= iVar3)) goto LAB_00535a93;
      if (pGold->vCis->nSize <= lVar18) goto LAB_00535af0;
      iVar4 = pGold->vCis->pArray[lVar18];
      if (((long)iVar4 < 0) || (iVar9 <= iVar4)) goto LAB_00535a93;
      pGVar6[iVar3].Value = pGold->pObjs[iVar4].Value;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  lVar17 = 0;
  lVar18 = 0;
  do {
    pGVar6 = pOld->pObjs;
    if (pGVar6 == (Gia_Obj_t *)0x0) break;
    uVar7 = *(ulong *)(&pGVar6->field_0x0 + lVar17);
    if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
      if ((Gia_Obj_t *)(&pGVar6->field_0x0 + lVar17) == pGVar1) {
        *(uint *)((long)&pGVar6->Value + lVar17) = uVar16;
      }
      else {
        uVar2 = *(uint *)((long)pGVar6 +
                         lVar17 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3 + 8);
        if (((int)uVar2 < 0) ||
           (uVar5 = *(uint *)((long)pGVar6 +
                             lVar17 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3 + 8),
           (int)uVar5 < 0)) goto LAB_00535ab2;
        iVar9 = Gia_ManHashAnd(p,uVar2 ^ (uint)(uVar7 >> 0x1d) & 1,uVar5 ^ (uint)(uVar7 >> 0x3d) & 1
                              );
        *(int *)((long)&pGVar6->Value + lVar17) = iVar9;
        iVar10 = pOld->nObjs;
      }
    }
    lVar18 = lVar18 + 1;
    lVar17 = lVar17 + 0xc;
  } while (lVar18 < iVar10);
LAB_005356c0:
  lVar17 = (long)pOld->vCos->nSize;
  if (0 < lVar17) {
    piVar8 = pOld->vCos->pArray;
    lVar18 = 0;
    do {
      iVar9 = piVar8[lVar18];
      if (((long)iVar9 < 0) || (iVar10 <= iVar9)) goto LAB_00535a93;
      if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar6 = pOld->pObjs + iVar9;
      if ((int)pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value < 0)
      goto LAB_00535ab2;
      pGVar6->Value =
           (uint)*(undefined8 *)pGVar6 >> 0x1d & 1 ^
           pGVar6[-(ulong)((uint)*(undefined8 *)pGVar6 & 0x1fffffff)].Value;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  pVVar14 = pGold->vCos;
  if (0 < pVVar14->nSize) {
    lVar17 = 0;
    do {
      iVar9 = pVVar14->pArray[lVar17];
      if (((long)iVar9 < 0) || (pGold->nObjs <= iVar9)) goto LAB_00535a93;
      if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
      if (pOld->vCos->nSize <= lVar17) goto LAB_00535af0;
      iVar10 = pOld->vCos->pArray[lVar17];
      if (((long)iVar10 < 0) || (pOld->nObjs <= iVar10)) goto LAB_00535a93;
      iVar9 = Gia_ManHashXor(p,pGold->pObjs[iVar9].Value,pOld->pObjs[iVar10].Value);
      Gia_ManAppendCo(p,iVar9);
      lVar17 = lVar17 + 1;
      pVVar14 = pGold->vCos;
    } while (lVar17 < pVVar14->nSize);
    iVar10 = pOld->nObjs;
  }
  if (0 < iVar10) {
    local_50 = uVar16 | 1;
    lVar18 = 0;
    lVar17 = 0;
    do {
      pGVar6 = pOld->pObjs;
      if (pGVar6 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)(&pGVar6->field_0x0 + lVar18);
      if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
        if ((Gia_Obj_t *)(&pGVar6->field_0x0 + lVar18) == pGVar1) {
          if ((int)uVar16 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf4,"int Abc_LitNot(int)");
          }
          *(uint *)((long)&pGVar6->Value + lVar18) = local_50;
        }
        else {
          uVar2 = *(uint *)((long)pGVar6 +
                           lVar18 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3 + 8);
          if (((int)uVar2 < 0) ||
             (uVar5 = *(uint *)((long)pGVar6 +
                               lVar18 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3 + 8),
             (int)uVar5 < 0)) goto LAB_00535ab2;
          iVar9 = Gia_ManHashAnd(p,uVar2 ^ (uint)(uVar7 >> 0x1d) & 1,
                                 uVar5 ^ (uint)(uVar7 >> 0x3d) & 1);
          *(int *)((long)&pGVar6->Value + lVar18) = iVar9;
          iVar10 = pOld->nObjs;
        }
      }
      lVar17 = lVar17 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar17 < iVar10);
  }
  lVar17 = (long)pOld->vCos->nSize;
  if (0 < lVar17) {
    piVar8 = pOld->vCos->pArray;
    lVar18 = 0;
    do {
      iVar9 = piVar8[lVar18];
      if (((long)iVar9 < 0) || (iVar10 <= iVar9)) goto LAB_00535a93;
      if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar1 = pOld->pObjs + iVar9;
      if ((int)pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value < 0) {
LAB_00535ab2:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      pGVar1->Value =
           (uint)*(undefined8 *)pGVar1 >> 0x1d & 1 ^
           pGVar1[-(ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff)].Value;
      lVar18 = lVar18 + 1;
    } while (lVar17 != lVar18);
  }
  pVVar14 = pGold->vCos;
  if (pVVar14->nSize < 1) {
    iVar9 = 0;
  }
  else {
    lVar17 = 0;
    iVar9 = 0;
    do {
      iVar10 = pVVar14->pArray[lVar17];
      if (((long)iVar10 < 0) || (pGold->nObjs <= iVar10)) goto LAB_00535a93;
      if (pGold->pObjs == (Gia_Obj_t *)0x0) break;
      if (pOld->vCos->nSize <= lVar17) goto LAB_00535af0;
      iVar3 = pOld->vCos->pArray[lVar17];
      if (((long)iVar3 < 0) || (pOld->nObjs <= iVar3)) goto LAB_00535a93;
      iVar10 = Gia_ManHashXor(p,pGold->pObjs[iVar10].Value,pOld->pObjs[iVar3].Value);
      iVar9 = Gia_ManHashOr(p,iVar9,iVar10);
      lVar17 = lVar17 + 1;
      pVVar14 = pGold->vCos;
    } while (lVar17 < pVVar14->nSize);
  }
  Gia_ManAppendCo(p,iVar9);
  if (0 < vFans->nSize) {
    lVar17 = 0;
    do {
      iVar9 = vFans->pArray[lVar17];
      if (((long)iVar9 < 0) || (pOld->nObjs <= iVar9)) goto LAB_00535a93;
      if (pOld->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManAppendCo(p,pOld->pObjs[iVar9].Value);
      lVar17 = lVar17 + 1;
    } while (lVar17 < vFans->nSize);
  }
  pGVar15 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  if (pGVar15->vCis->nSize - pGVar15->nRegs != pGold->vCis->nSize + 1) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x65,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  if (pGVar15->vCos->nSize - pGVar15->nRegs != pGold->vCos->nSize + vFans->nSize + 1) {
    __assert_fail("Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0x66,"Gia_Man_t *Bmc_EcoMiter(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *)");
  }
  return pGVar15;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes miter for ECO with given root node and fanins.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Gia_Man_t * Bmc_EcoMiter( Gia_Man_t * pGold, Gia_Man_t * pOld, Vec_Int_t * vFans )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pRoot = Gia_ObjFanin0( Gia_ManPo(pOld, Gia_ManPoNum(pOld)-1) ); // fanin of the last PO
    Gia_Obj_t * pObj;
    int i, NewPi, Miter;
    assert( Gia_ManCiNum(pGold) == Gia_ManCiNum(pOld) );
    assert( Gia_ManCoNum(pGold) == Gia_ManCoNum(pOld) - 1 );
    assert( Gia_ObjIsAnd(pRoot) );
    // create the miter
    pNew = Gia_ManStart( 3 * Gia_ManObjNum(pGold) );
    pNew->pName = Abc_UtilStrsav( pGold->pName );
    Gia_ManHashAlloc( pNew );
    // copy gold
    Gia_ManConst0(pGold)->Value = 0;
    Gia_ManForEachCi( pGold, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    NewPi = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( pGold, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pGold, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    // create onset
    Gia_ManConst0(pOld)->Value = 0;
    Gia_ManForEachCi( pOld, pObj, i )
        pObj->Value = Gia_ManCi(pGold, i)->Value;
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = NewPi;
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Gia_ManForEachCo( pGold, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    // create offset
    Gia_ManForEachAnd( pOld, pObj, i )
        if ( pObj == pRoot )
            pObj->Value = Abc_LitNot(NewPi);
        else
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( pOld, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy( pObj );
    Miter = 0;
    Gia_ManForEachCo( pGold, pObj, i )
        Miter = Gia_ManHashOr( pNew, Miter, Gia_ManHashXor(pNew, pObj->Value, Gia_ManCo(pOld, i)->Value) );
    Gia_ManAppendCo( pNew, Miter );
    // add outputs for the nodes
    Gia_ManForEachObjVec( vFans, pOld, pObj, i )
        Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(pGold) + 1 );
    assert( Gia_ManPoNum(pNew) == Gia_ManCoNum(pGold) + 1 + Vec_IntSize(vFans) );
    return pNew;
}